

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

shared_ptr<const_void> __thiscall
pstore::database::get(database *this,address addr,size_t size,bool initialized,bool writable)

{
  bool bVar1;
  undefined7 in_register_00000009;
  bool in_R9B;
  shared_ptr<const_void> sVar3;
  address local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_38.a_ = size;
  check_get_params((database *)addr.a_,(address)size,CONCAT71(in_register_00000009,initialized),
                   in_R9B);
  bVar1 = storage::request_spans_regions
                    ((storage *)(addr.a_ + 8),&local_38,CONCAT71(in_register_00000009,initialized));
  if (bVar1) {
    sVar3 = get_spanning(this,addr,local_38.a_,initialized,writable);
    _Var2 = sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    sVar3 = storage::address_to_pointer_impl<pstore::storage_const,std::shared_ptr<void_const>>
                      ((storage *)this,(storage *)(addr.a_ + 8),local_38);
    _Var2 = sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<const_void>)sVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto database::get (address const addr, std::size_t const size, bool const initialized,
                        bool const writable) const -> std::shared_ptr<void const> {
        this->check_get_params (addr, size, writable);
        if (storage_.request_spans_regions (addr, size)) {
            return this->get_spanning (addr, size, initialized, writable);
        }
        return storage_.address_to_pointer (addr);
    }